

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_13.cpp
# Opt level: O0

int main(void)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_388;
  exception *e;
  StringData sd;
  vector<unsigned_long,_std::allocator<unsigned_long>_> lengths;
  allocator<char> local_200;
  allocator<char> local_1ff;
  allocator<char> local_1fe;
  allocator<char> local_1fd;
  allocator<char> local_1fc;
  allocator<char> local_1fb;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  allocator<char> local_1f8;
  allocator<char> local_1f7;
  allocator<char> local_1f6;
  allocator<char> local_1f5 [20];
  allocator<char> local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  local_1e0 = &local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"When",&local_1e1);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"you",local_1f5);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_198,"have",&local_1f6);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"exhausted",&local_1f7);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"all",&local_1f8);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"posibilities",&local_1f9);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,",",&local_1fa);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"remember",&local_1fb);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"this",&local_1fc);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"-",&local_1fd);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"you",&local_1fe);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"haven\'t",&local_1ff);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,".",&local_200);
  lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  local_38 = &local_1d8;
  local_30 = 0xd;
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 6);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l,this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  local_388 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_388 = local_388 + -1;
    std::__cxx11::string::~string((string *)local_388);
  } while (local_388 != &local_1d8);
  std::allocator<char>::~allocator(&local_200);
  std::allocator<char>::~allocator(&local_1ff);
  std::allocator<char>::~allocator(&local_1fe);
  std::allocator<char>::~allocator(&local_1fd);
  std::allocator<char>::~allocator(&local_1fc);
  std::allocator<char>::~allocator(&local_1fb);
  std::allocator<char>::~allocator(&local_1fa);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::~allocator(&local_1f8);
  std::allocator<char>::~allocator(&local_1f7);
  std::allocator<char>::~allocator(&local_1f6);
  std::allocator<char>::~allocator(local_1f5);
  std::allocator<char>::~allocator(&local_1e1);
  str_lengths((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)&sd.last.field_2 + 8),
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_28);
  analyze_strings((StringData *)&e,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,"Longest: \'");
  poVar1 = std::operator<<(poVar1,(string *)&e);
  poVar1 = std::operator<<(poVar1,"\'\nShortest: \'");
  poVar1 = std::operator<<(poVar1,(string *)(sd.longest.field_2._M_local_buf + 8));
  poVar1 = std::operator<<(poVar1,"\'\nLexicographically first: \'");
  poVar1 = std::operator<<(poVar1,(string *)(sd.shortest.field_2._M_local_buf + 8));
  poVar1 = std::operator<<(poVar1,"\'\nLexicographically last: \'");
  poVar1 = std::operator<<(poVar1,(string *)(sd.first.field_2._M_local_buf + 8));
  std::operator<<(poVar1,"\'\n");
  StringData::~StringData((StringData *)&e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)&sd.last.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return 0;
}

Assistant:

int main()
{
	try
	{
		std::vector<std::string> strings{
			"When", "you", "have", "exhausted", "all", "posibilities", ",", "remember",
			"this", "-", "you", "haven't", "."
		};

		auto lengths = str_lengths(strings);
		auto sd = analyze_strings(strings);

		std::cout << "Longest: '" << sd.longest
			<< "'\nShortest: '" << sd.shortest
			<< "'\nLexicographically first: '" << sd.first
			<< "'\nLexicographically last: '" << sd.last
			<< "'\n";
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
	return 0;
}